

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O2

void __thiscall helics::BaseTimeCoordinator::sendTimingInfo(BaseTimeCoordinator *this)

{
  pointer pDVar1;
  DependencyInfo *dep;
  pointer pDVar2;
  ActionMessage tinfo;
  ActionMessage AStack_d8;
  
  ActionMessage::ActionMessage(&AStack_d8,cmd_timing_info);
  AStack_d8.source_id.gid = (this->mSourceId).gid;
  if (this->nonGranting == true) {
    AStack_d8.flags._0_1_ = (byte)AStack_d8.flags | 0x80;
  }
  if (this->delayedTiming == true) {
    AStack_d8.flags._1_1_ = AStack_d8.flags._1_1_ | 4;
  }
  AStack_d8.dest_handle.hid = 1;
  pDVar1 = (this->dependencies).dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pDVar2 = (this->dependencies).dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pDVar2 != pDVar1; pDVar2 = pDVar2 + 1) {
    if (pDVar2->dependent == true) {
      AStack_d8.dest_id.gid = (pDVar2->fedID).gid;
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                (&this->sendMessageFunction,&AStack_d8);
    }
  }
  ActionMessage::~ActionMessage(&AStack_d8);
  return;
}

Assistant:

void BaseTimeCoordinator::sendTimingInfo()
{
    ActionMessage tinfo(CMD_TIMING_INFO);
    tinfo.source_id = mSourceId;
    if (nonGranting) {
        setActionFlag(tinfo, non_granting_flag);
    }
    if (delayedTiming) {
        setActionFlag(tinfo, delayed_timing_flag);
    }
    tinfo.setExtraData(TIME_COORDINATOR_VERSION);

    for (const auto& dep : dependencies) {
        if (dep.dependent) {
            tinfo.dest_id = dep.fedID;
            sendMessageFunction(tinfo);
        }
    }
}